

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QString * __thiscall QHash<QString,_QString>::value(QHash<QString,_QString> *this,QString *key)

{
  QString *pQVar1;
  QString *in_RDI;
  QString *v;
  QString *in_stack_ffffffffffffffc8;
  QString *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<QString>((QHash<QString,_QString> *)in_RDI,in_RDI);
  if (pQVar1 == (QString *)0x0) {
    QString::QString((QString *)0x1277cb);
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }